

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

size_t plain_method(char *method,size_t method_len)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = strncmp("ssh-rsa-cert-v01@openssh.com",method,method_len);
  if (iVar1 == 0) {
    sVar2 = 7;
  }
  else {
    iVar1 = strncmp("rsa-sha2-256-cert-v01@openssh.com",method,method_len);
    sVar2 = 0xc;
    if (iVar1 != 0) {
      iVar1 = strncmp("rsa-sha2-512-cert-v01@openssh.com",method,method_len);
      if (iVar1 != 0) {
        iVar1 = strncmp("ecdsa-sha2-nistp256-cert-v01@openssh.com",method,method_len);
        sVar2 = 0x13;
        if (iVar1 != 0) {
          iVar1 = strncmp("ecdsa-sha2-nistp384-cert-v01@openssh.com",method,method_len);
          if (iVar1 != 0) {
            iVar1 = strncmp("ecdsa-sha2-nistp521-cert-v01@openssh.com",method,method_len);
            if (iVar1 != 0) {
              iVar1 = strncmp("ssh-ed25519-cert-v01@openssh.com",method,method_len);
              if (iVar1 == 0) {
                sVar2 = 0xb;
              }
              else {
                iVar1 = strncmp("sk-ecdsa-sha2-nistp256-cert-v01@openssh.com",method,method_len);
                if (iVar1 == 0) {
                  builtin_strncpy(method,"sk-ecdsa-sha2-nistp256@openssh.com",0x22);
                  sVar2 = 0x22;
                }
                else {
                  iVar1 = strncmp("sk-ssh-ed25519-cert-v01@openssh.com",method,method_len);
                  sVar2 = method_len;
                  if (iVar1 == 0) {
                    builtin_strncpy(method,"sk-ssh-ed25519@openssh.com",0x1a);
                    sVar2 = 0x1a;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar2;
}

Assistant:

size_t plain_method(char *method, size_t method_len)
{
    if(!strncmp("ssh-rsa-cert-v01@openssh.com",
                method,
                method_len)) {
        return 7;
    }

    if(!strncmp("rsa-sha2-256-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("rsa-sha2-512-cert-v01@openssh.com",
                method,
                method_len)) {
       return 12;
    }

    if(!strncmp("ecdsa-sha2-nistp256-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("ecdsa-sha2-nistp384-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("ecdsa-sha2-nistp521-cert-v01@openssh.com",
                method,
                method_len)) {
        return 19;
    }

    if(!strncmp("ssh-ed25519-cert-v01@openssh.com",
                method,
                method_len)) {
        return 11;
    }

    if(!strncmp("sk-ecdsa-sha2-nistp256-cert-v01@openssh.com",
                method,
                method_len)) {
        const char *new_method = "sk-ecdsa-sha2-nistp256@openssh.com";
        memcpy(method, new_method, strlen(new_method));
        return strlen(new_method);
    }

    if(!strncmp("sk-ssh-ed25519-cert-v01@openssh.com",
                method,
                method_len)) {
        const char *new_method = "sk-ssh-ed25519@openssh.com";
        memcpy(method, new_method, strlen(new_method));
        return strlen(new_method);
    }

    return method_len;
}